

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O3

bool __thiscall
dg::pta::PointerIdPointsToSet::pointsToTarget(PointerIdPointsToSet *this,PSNode *target)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  const_iterator __begin2;
  const_iterator local_38;
  
  local_38.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (this->pointers)._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_before_begin._M_nxt;
  local_38.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_38.pos = 0;
  if ((this->pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    uVar1 = *(ulong *)((long)&(((__node_type *)
                               local_38.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    local_38.pos = 0;
    uVar2 = uVar1 & 1;
    while (uVar2 == 0) {
      if (local_38.pos == 0x3f) {
        local_38.pos = 0x40;
        break;
      }
      bVar3 = (byte)local_38.pos;
      local_38.pos = local_38.pos + 1;
      uVar2 = uVar1 >> (bVar3 & 0x3f) & 2;
    }
  }
  if (local_38.pos == 0 &&
      local_38.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    bVar4 = false;
  }
  else {
    do {
      bVar4 = *(PSNode **)
               ((long)((_Hash_node_base *)
                      ((long)local_38.container_it.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                             ._M_cur + 8))->_M_nxt * 0x10 + -0x10 + local_38.pos * 0x10 + __M_assign
               ) == target;
      if (bVar4) {
        return bVar4;
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_38);
    } while (local_38.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_38.pos != 0);
  }
  return bVar4;
}

Assistant:

bool pointsToTarget(PSNode *target) const {
        for (auto ptrid : pointers) {
            const auto &ptr = getPointer(ptrid);
            if (ptr.target == target) {
                return true;
            }
        }
        return false;
    }